

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O1

el_action_t em_universal_argument(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  el_action_t eVar2;
  
  wVar1 = (el->el_state).argument;
  eVar2 = '\x06';
  if (wVar1 < L'\x000f4241') {
    (el->el_state).doingarg = L'\x01';
    (el->el_state).argument = wVar1 << 2;
    eVar2 = '\x03';
  }
  return eVar2;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_universal_argument(EditLine *el, wint_t c __attribute__((__unused__)))
{				/* multiply current argument by 4 */

	if (el->el_state.argument > 1000000)
		return CC_ERROR;
	el->el_state.doingarg = 1;
	el->el_state.argument *= 4;
	return CC_ARGHACK;
}